

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O2

void __thiscall cmsys::RegularExpression::RegularExpression(RegularExpression *this,string *s)

{
  this->regmust = (char *)0x0;
  this->program = (char *)0x0;
  this->progsize = 0;
  memset(this,0,0xaa);
  compile(this,s);
  return;
}

Assistant:

inline RegularExpression::RegularExpression(const std::string& s)
  : regstart{}
  , reganch{}
  , regmust{}
  , program{ nullptr }
  , progsize{}
{
  this->compile(s);
}